

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<FileHeader>::copyAppend
          (QGenericArrayOps<FileHeader> *this,FileHeader *b,FileHeader *e)

{
  FileHeader *this_00;
  ulong in_RDX;
  ulong in_RSI;
  FileHeader *in_RDI;
  FileHeader *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<FileHeader>::begin((QArrayDataPointer<FileHeader> *)0x325017);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      FileHeader::FileHeader(this_00,in_RDI);
      local_10 = local_10 + 0x78;
      *(long *)(in_RDI->h).crc_32 = *(long *)(in_RDI->h).crc_32 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }